

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_frameProgression *
ZSTDMT_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ZSTDMT_jobDescription *pZVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ZSTDMT_jobDescription *pZVar10;
  unsigned_long_long uVar11;
  uint uVar12;
  unsigned_long_long uVar13;
  unsigned_long_long local_58;
  unsigned_long_long local_50;
  
  uVar13 = mtctx->consumed;
  sVar3 = (mtctx->inBuff).filled;
  uVar11 = mtctx->produced;
  uVar1 = mtctx->nextJobID;
  __return_storage_ptr__->currentJobID = uVar1;
  iVar2 = mtctx->jobReady;
  if (1 < iVar2) {
    __assert_fail("mtctx->jobReady <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x892b,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
  }
  local_50 = sVar3 + uVar13;
  uVar12 = mtctx->doneJobID;
  uVar8 = 0;
  local_58 = uVar11;
  while( true ) {
    if (iVar2 + uVar1 <= uVar12) {
      __return_storage_ptr__->ingested = local_50;
      __return_storage_ptr__->consumed = uVar13;
      __return_storage_ptr__->produced = local_58;
      __return_storage_ptr__->flushed = uVar11;
      __return_storage_ptr__->nbActiveWorkers = uVar8;
      return __return_storage_ptr__;
    }
    uVar7 = mtctx->jobIDMask & uVar12;
    pZVar4 = mtctx->jobs;
    pZVar10 = pZVar4 + uVar7;
    pthread_mutex_lock((pthread_mutex_t *)&pZVar4[uVar7].job_mutex);
    uVar5 = pZVar4[uVar7].cSize;
    uVar9 = 0;
    uVar6 = 0;
    if ((uVar5 < 0xffffffffffffff89) && (uVar9 = pZVar10->dstFlushed, uVar6 = uVar5, uVar5 < uVar9))
    break;
    uVar5 = (pZVar10->src).size;
    local_50 = local_50 + uVar5;
    uVar13 = uVar13 + pZVar10->consumed;
    local_58 = local_58 + uVar6;
    uVar11 = uVar11 + uVar9;
    uVar8 = uVar8 + (pZVar10->consumed < uVar5);
    pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar7].job_mutex);
    uVar12 = uVar12 + 1;
  }
  __return_storage_ptr__->ingested = local_50;
  __return_storage_ptr__->consumed = uVar13;
  __return_storage_ptr__->produced = local_58;
  __return_storage_ptr__->flushed = uVar11;
  __return_storage_ptr__->nbActiveWorkers = uVar8;
  __assert_fail("flushed <= produced",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x8935,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
}

Assistant:

ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx* mtctx)
{
    ZSTD_frameProgression fps;
    DEBUGLOG(5, "ZSTDMT_getFrameProgression");
    fps.ingested = mtctx->consumed + mtctx->inBuff.filled;
    fps.consumed = mtctx->consumed;
    fps.produced = fps.flushed = mtctx->produced;
    fps.currentJobID = mtctx->nextJobID;
    fps.nbActiveWorkers = 0;
    {   unsigned jobNb;
        unsigned lastJobNb = mtctx->nextJobID + mtctx->jobReady; assert(mtctx->jobReady <= 1);
        DEBUGLOG(6, "ZSTDMT_getFrameProgression: jobs: from %u to <%u (jobReady:%u)",
                    mtctx->doneJobID, lastJobNb, mtctx->jobReady)
        for (jobNb = mtctx->doneJobID ; jobNb < lastJobNb ; jobNb++) {
            unsigned const wJobID = jobNb & mtctx->jobIDMask;
            ZSTDMT_jobDescription* jobPtr = &mtctx->jobs[wJobID];
            ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
            {   size_t const cResult = jobPtr->cSize;
                size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
                size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
                assert(flushed <= produced);
                fps.ingested += jobPtr->src.size;
                fps.consumed += jobPtr->consumed;
                fps.produced += produced;
                fps.flushed  += flushed;
                fps.nbActiveWorkers += (jobPtr->consumed < jobPtr->src.size);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        }
    }
    return fps;
}